

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_meshb_next_position(FILE *file,REF_INT version,REF_FILEPOS next_position)

{
  size_t sVar1;
  undefined8 uVar2;
  int32_t one_word;
  int64_t two_word;
  undefined4 local_14;
  REF_FILEPOS local_10;
  
  if (version < 3) {
    if (next_position - 0x80000000U < 0xffffffff00000001) {
      printf("next_position %ld outside int32 limits %d %d\n",next_position,0x80000001,0x7fffffff);
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             0x761,"ref_export_meshb_next_position",3,"meshb version does not support file size");
      return 3;
    }
    local_14 = (undefined4)next_position;
    sVar1 = fwrite(&local_14,4,1,(FILE *)file);
    if (sVar1 == 1) {
      return 0;
    }
    uVar2 = 0x764;
  }
  else {
    local_10 = next_position;
    sVar1 = fwrite(&local_10,8,1,(FILE *)file);
    if (sVar1 == 1) {
      return 0;
    }
    uVar2 = 0x75c;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar2,
         "ref_export_meshb_next_position","write next pos",1,sVar1);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_export_meshb_next_position(FILE *file, REF_INT version,
                                                  REF_FILEPOS next_position) {
  int32_t one_word;
  int64_t two_word;

  if (3 <= version) {
    two_word = (int64_t)next_position;
    REIS(1, fwrite(&two_word, sizeof(two_word), 1, file), "write next pos");
  } else {
    if (next_position < -2147483647 || 2147483647 < next_position) {
      printf("next_position %ld outside int32 limits %d %d\n",
             (REF_LONG)next_position, -2147483647, 2147483647);
      RSS(REF_INVALID, "meshb version does not support file size");
    }
    one_word = (int32_t)next_position;
    REIS(1, fwrite(&one_word, sizeof(one_word), 1, file), "write next pos");
  }

  return REF_SUCCESS;
}